

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Dtc_ManCutMergeOne(int *pCut0,int *pCut1,int *pCut)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  for (lVar3 = 0; lVar3 <= *pCut1; lVar3 = lVar3 + 1) {
    pCut[lVar3] = pCut1[lVar3];
  }
  lVar3 = 1;
  do {
    if (*pCut0 < lVar3) {
      if ((*pCut & 0xfffffffeU) != 2) {
        __assert_fail("pCut[0] == 2 || pCut[0] == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0xcb,"int Dtc_ManCutMergeOne(int *, int *, int *)");
      }
      iVar6 = pCut[1];
      iVar7 = pCut[2];
      iVar4 = iVar6;
      if (iVar7 < iVar6) {
        pCut[1] = iVar7;
        pCut[2] = iVar6;
        iVar4 = iVar7;
        iVar7 = iVar6;
      }
      if (iVar4 < iVar7) {
        if (*pCut != 2) {
          iVar6 = pCut[3];
          iVar5 = iVar7;
          if (iVar6 < iVar7) {
            pCut[2] = iVar6;
            pCut[3] = iVar7;
            iVar5 = iVar6;
            iVar6 = iVar7;
          }
          iVar7 = iVar4;
          if (iVar5 < iVar4) {
            pCut[1] = iVar5;
            pCut[2] = iVar4;
            iVar7 = iVar5;
            iVar5 = iVar4;
          }
          if (iVar5 <= iVar7) {
            __assert_fail("pCut[1] < pCut[2]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0xd5,"int Dtc_ManCutMergeOne(int *, int *, int *)");
          }
          if (iVar6 <= iVar5) {
            __assert_fail("pCut[2] < pCut[3]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0xd6,"int Dtc_ManCutMergeOne(int *, int *, int *)");
          }
        }
        return 1;
      }
      __assert_fail("pCut[1] < pCut[2]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0xce,"int Dtc_ManCutMergeOne(int *, int *, int *)");
    }
    uVar1 = *pCut1;
    if (*pCut1 < 1) {
      uVar1 = 0;
    }
    uVar8 = 0;
    do {
      if (uVar1 == uVar8) {
        iVar6 = *pCut;
        if ((long)iVar6 == 3) {
          return 0;
        }
        iVar7 = pCut0[lVar3];
        *pCut = iVar6 + 1;
        pCut[(long)iVar6 + 1] = iVar7;
        break;
      }
      lVar2 = uVar8 + 1;
      uVar8 = uVar8 + 1;
    } while (pCut0[lVar3] != pCut1[lVar2]);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int Dtc_ManCutMergeOne( int * pCut0, int * pCut1, int * pCut )
{
    int i, k;
    for ( k = 0; k <= pCut1[0]; k++ )
        pCut[k] = pCut1[k];
    for ( i = 1; i <= pCut0[0]; i++ )
    {
        for ( k = 1; k <= pCut1[0]; k++ )
            if ( pCut0[i] == pCut1[k] )
                break;
        if ( k <= pCut1[0] )
            continue;
        if ( pCut[0] == 3 )
            return 0;
        pCut[1+pCut[0]++] = pCut0[i];
    }
    assert( pCut[0] == 2 || pCut[0] == 3 );
    if ( pCut[1] > pCut[2] )
        ABC_SWAP( int, pCut[1], pCut[2] );
    assert( pCut[1] < pCut[2] );
    if ( pCut[0] == 2 )
        return 1;
    if ( pCut[2] > pCut[3] )
        ABC_SWAP( int, pCut[2], pCut[3] );
    if ( pCut[1] > pCut[2] )
        ABC_SWAP( int, pCut[1], pCut[2] );
    assert( pCut[1] < pCut[2] );
    assert( pCut[2] < pCut[3] );
    return 1;
}